

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

void ExtractGreen_SSE2(uint32_t *argb,uint8_t *alpha,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i e;
  __m128i d1;
  __m128i d0;
  __m128i c3;
  __m128i c2;
  __m128i c1;
  __m128i c0;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  __m128i *src;
  __m128i mask;
  int i;
  undefined8 *local_2f0;
  int local_2d0;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  __m128i e_1;
  __m128i d;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  
  local_2f0 = in_RDI;
  for (local_2d0 = 0; local_2d0 + 0x10 <= in_EDX; local_2d0 = local_2d0 + 0x10) {
    a1_1[1]._0_4_ = (uint)*local_2f0;
    a0_1[0]._0_4_ = (uint)local_2f0[1];
    b1_1[1]._0_4_ = (uint)local_2f0[2];
    b0_1[0]._0_4_ = (uint)local_2f0[3];
    c1_1[1]._0_4_ = (uint)local_2f0[4];
    c0_1[0]._0_4_ = (uint)local_2f0[5];
    e_1[1]._0_4_ = (uint)local_2f0[6];
    d[0]._0_4_ = (uint)local_2f0[7];
    auVar4._8_8_ = CONCAT44((uint)((ulong)local_2f0[1] >> 0x28),(uint)a0_1[0] >> 8) & 0xff000000ff;
    auVar4._0_8_ = CONCAT44((uint)((ulong)*local_2f0 >> 0x28),(uint)a1_1[1] >> 8) & 0xff000000ff;
    auVar5._8_8_ = CONCAT44((uint)((ulong)local_2f0[3] >> 0x28),(uint)b0_1[0] >> 8) & 0xff000000ff;
    auVar5._0_8_ = CONCAT44((uint)((ulong)local_2f0[2] >> 0x28),(uint)b1_1[1] >> 8) & 0xff000000ff;
    auVar5 = packssdw(auVar4,auVar5);
    auVar3._8_8_ = CONCAT44((uint)((ulong)local_2f0[5] >> 0x28),(uint)c0_1[0] >> 8) & 0xff000000ff;
    auVar3._0_8_ = CONCAT44((uint)((ulong)local_2f0[4] >> 0x28),(uint)c1_1[1] >> 8) & 0xff000000ff;
    auVar6._8_8_ = CONCAT44((uint)((ulong)local_2f0[7] >> 0x28),(uint)d[0] >> 8) & 0xff000000ff;
    auVar6._0_8_ = CONCAT44((uint)((ulong)local_2f0[6] >> 0x28),(uint)e_1[1] >> 8) & 0xff000000ff;
    auVar6 = packssdw(auVar3,auVar6);
    local_288 = auVar5._0_2_;
    sStack_286 = auVar5._2_2_;
    sStack_284 = auVar5._4_2_;
    sStack_282 = auVar5._6_2_;
    sStack_280 = auVar5._8_2_;
    sStack_27e = auVar5._10_2_;
    sStack_27c = auVar5._12_2_;
    sStack_27a = auVar5._14_2_;
    local_298 = auVar6._0_2_;
    sStack_296 = auVar6._2_2_;
    sStack_294 = auVar6._4_2_;
    sStack_292 = auVar6._6_2_;
    sStack_290 = auVar6._8_2_;
    sStack_28e = auVar6._10_2_;
    sStack_28c = auVar6._12_2_;
    sStack_28a = auVar6._14_2_;
    *(undefined8 *)(in_RSI + local_2d0) =
         CONCAT17((0 < sStack_27a) * (sStack_27a < 0x100) * auVar5[0xe] - (0xff < sStack_27a),
                  CONCAT16((0 < sStack_27c) * (sStack_27c < 0x100) * auVar5[0xc] -
                           (0xff < sStack_27c),
                           CONCAT15((0 < sStack_27e) * (sStack_27e < 0x100) * auVar5[10] -
                                    (0xff < sStack_27e),
                                    CONCAT14((0 < sStack_280) * (sStack_280 < 0x100) * auVar5[8] -
                                             (0xff < sStack_280),
                                             CONCAT13((0 < sStack_282) * (sStack_282 < 0x100) *
                                                      auVar5[6] - (0xff < sStack_282),
                                                      CONCAT12((0 < sStack_284) *
                                                               (sStack_284 < 0x100) * auVar5[4] -
                                                               (0xff < sStack_284),
                                                               CONCAT11((0 < sStack_286) *
                                                                        (sStack_286 < 0x100) *
                                                                        auVar5[2] -
                                                                        (0xff < sStack_286),
                                                                        (0 < local_288) *
                                                                        (local_288 < 0x100) *
                                                                        auVar5[0] -
                                                                        (0xff < local_288))))))));
    ((undefined8 *)(in_RSI + local_2d0))[1] =
         CONCAT17((0 < sStack_28a) * (sStack_28a < 0x100) * auVar6[0xe] - (0xff < sStack_28a),
                  CONCAT16((0 < sStack_28c) * (sStack_28c < 0x100) * auVar6[0xc] -
                           (0xff < sStack_28c),
                           CONCAT15((0 < sStack_28e) * (sStack_28e < 0x100) * auVar6[10] -
                                    (0xff < sStack_28e),
                                    CONCAT14((0 < sStack_290) * (sStack_290 < 0x100) * auVar6[8] -
                                             (0xff < sStack_290),
                                             CONCAT13((0 < sStack_292) * (sStack_292 < 0x100) *
                                                      auVar6[6] - (0xff < sStack_292),
                                                      CONCAT12((0 < sStack_294) *
                                                               (sStack_294 < 0x100) * auVar6[4] -
                                                               (0xff < sStack_294),
                                                               CONCAT11((0 < sStack_296) *
                                                                        (sStack_296 < 0x100) *
                                                                        auVar6[2] -
                                                                        (0xff < sStack_296),
                                                                        (0 < local_298) *
                                                                        (local_298 < 0x100) *
                                                                        auVar6[0] -
                                                                        (0xff < local_298))))))));
    local_2f0 = local_2f0 + 8;
  }
  if (local_2d0 + 8 <= in_EDX) {
    local_98 = (uint)*local_2f0;
    uStack_90 = (uint)local_2f0[1];
    local_b8 = (uint)local_2f0[2];
    uStack_b0 = (uint)local_2f0[3];
    auVar2._8_8_ = CONCAT44((uint)((ulong)local_2f0[1] >> 0x28),uStack_90 >> 8) & 0xff000000ff;
    auVar2._0_8_ = CONCAT44((uint)((ulong)*local_2f0 >> 0x28),local_98 >> 8) & 0xff000000ff;
    auVar1._8_8_ = CONCAT44((uint)((ulong)local_2f0[3] >> 0x28),uStack_b0 >> 8) & 0xff000000ff;
    auVar1._0_8_ = CONCAT44((uint)((ulong)local_2f0[2] >> 0x28),local_b8 >> 8) & 0xff000000ff;
    auVar6 = packssdw(auVar2,auVar1);
    local_2a8 = auVar6._0_2_;
    sStack_2a6 = auVar6._2_2_;
    sStack_2a4 = auVar6._4_2_;
    sStack_2a2 = auVar6._6_2_;
    sStack_2a0 = auVar6._8_2_;
    sStack_29e = auVar6._10_2_;
    sStack_29c = auVar6._12_2_;
    sStack_29a = auVar6._14_2_;
    *(ulong *)(in_RSI + local_2d0) =
         CONCAT17((0 < sStack_29a) * (sStack_29a < 0x100) * auVar6[0xe] - (0xff < sStack_29a),
                  CONCAT16((0 < sStack_29c) * (sStack_29c < 0x100) * auVar6[0xc] -
                           (0xff < sStack_29c),
                           CONCAT15((0 < sStack_29e) * (sStack_29e < 0x100) * auVar6[10] -
                                    (0xff < sStack_29e),
                                    CONCAT14((0 < sStack_2a0) * (sStack_2a0 < 0x100) * auVar6[8] -
                                             (0xff < sStack_2a0),
                                             CONCAT13((0 < sStack_2a2) * (sStack_2a2 < 0x100) *
                                                      auVar6[6] - (0xff < sStack_2a2),
                                                      CONCAT12((0 < sStack_2a4) *
                                                               (sStack_2a4 < 0x100) * auVar6[4] -
                                                               (0xff < sStack_2a4),
                                                               CONCAT11((0 < sStack_2a6) *
                                                                        (sStack_2a6 < 0x100) *
                                                                        auVar6[2] -
                                                                        (0xff < sStack_2a6),
                                                                        (0 < local_2a8) *
                                                                        (local_2a8 < 0x100) *
                                                                        auVar6[0] -
                                                                        (0xff < local_2a8))))))));
    local_2d0 = local_2d0 + 8;
  }
  for (; local_2d0 < in_EDX; local_2d0 = local_2d0 + 1) {
    *(char *)(in_RSI + local_2d0) =
         (char)((uint)*(undefined4 *)((long)in_RDI + (long)local_2d0 * 4) >> 8);
  }
  return;
}

Assistant:

static void ExtractGreen_SSE2(const uint32_t* WEBP_RESTRICT argb,
                              uint8_t* WEBP_RESTRICT alpha, int size) {
  int i;
  const __m128i mask = _mm_set1_epi32(0xff);
  const __m128i* src = (const __m128i*)argb;

  for (i = 0; i + 16 <= size; i += 16, src += 4) {
    const __m128i a0 = _mm_loadu_si128(src + 0);
    const __m128i a1 = _mm_loadu_si128(src + 1);
    const __m128i a2 = _mm_loadu_si128(src + 2);
    const __m128i a3 = _mm_loadu_si128(src + 3);
    const __m128i b0 = _mm_srli_epi32(a0, 8);
    const __m128i b1 = _mm_srli_epi32(a1, 8);
    const __m128i b2 = _mm_srli_epi32(a2, 8);
    const __m128i b3 = _mm_srli_epi32(a3, 8);
    const __m128i c0 = _mm_and_si128(b0, mask);
    const __m128i c1 = _mm_and_si128(b1, mask);
    const __m128i c2 = _mm_and_si128(b2, mask);
    const __m128i c3 = _mm_and_si128(b3, mask);
    const __m128i d0 = _mm_packs_epi32(c0, c1);
    const __m128i d1 = _mm_packs_epi32(c2, c3);
    const __m128i e = _mm_packus_epi16(d0, d1);
    // store
    _mm_storeu_si128((__m128i*)&alpha[i], e);
  }
  if (i + 8 <= size) {
    const __m128i a0 = _mm_loadu_si128(src + 0);
    const __m128i a1 = _mm_loadu_si128(src + 1);
    const __m128i b0 = _mm_srli_epi32(a0, 8);
    const __m128i b1 = _mm_srli_epi32(a1, 8);
    const __m128i c0 = _mm_and_si128(b0, mask);
    const __m128i c1 = _mm_and_si128(b1, mask);
    const __m128i d = _mm_packs_epi32(c0, c1);
    const __m128i e = _mm_packus_epi16(d, d);
    _mm_storel_epi64((__m128i*)&alpha[i], e);
    i += 8;
  }
  for (; i < size; ++i) alpha[i] = argb[i] >> 8;
}